

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall
S2Polygon::Init(S2Polygon *this,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop)

{
  S2Loop *pSVar1;
  
  ClearLoops(this);
  pSVar1 = (loop->_M_t).super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
           super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
           super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
  if ((pSVar1->num_vertices_ == 1) && ((pSVar1->origin_inside_ & 1U) == 0)) {
    InitLoopProperties(this);
    return;
  }
  std::
  vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
  ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
            ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
              *)&this->loops_,loop);
  InitOneLoop(this);
  return;
}

Assistant:

void S2Polygon::Init(unique_ptr<S2Loop> loop) {
  // We don't allow empty loops in the other Init() methods because deleting
  // them changes the number of loops, which is awkward to handle.
  ClearLoops();
  if (loop->is_empty()) {
    InitLoopProperties();
  } else {
    loops_.push_back(std::move(loop));
    InitOneLoop();
  }
}